

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O3

int CBS_asn1_ber_to_der(CBS *in,CBS *out,uint8_t **out_storage)

{
  int iVar1;
  int conversion_needed;
  size_t len;
  CBB cbb;
  int local_5c;
  size_t local_58;
  CBB local_50;
  
  iVar1 = cbs_find_ber(in,&local_5c,0);
  if (iVar1 == 0) {
    return 0;
  }
  if (local_5c == 0) {
    iVar1 = CBS_get_any_asn1_element(in,out,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
    if (iVar1 == 0) {
      return 0;
    }
    *out_storage = (uint8_t *)0x0;
  }
  else {
    iVar1 = CBB_init(&local_50,in->len);
    if (((iVar1 == 0) || (iVar1 = cbs_convert_ber(in,&local_50,0,0,0), iVar1 == 0)) ||
       (iVar1 = CBB_finish(&local_50,out_storage,&local_58), iVar1 == 0)) {
      CBB_cleanup(&local_50);
      return 0;
    }
    out->data = *out_storage;
    out->len = local_58;
  }
  return 1;
}

Assistant:

int CBS_asn1_ber_to_der(CBS *in, CBS *out, uint8_t **out_storage) {
  CBB cbb;

  // First, do a quick walk to find any indefinite-length elements. Most of the
  // time we hope that there aren't any and thus we can quickly return.
  int conversion_needed;
  if (!cbs_find_ber(in, &conversion_needed, 0)) {
    return 0;
  }

  if (!conversion_needed) {
    if (!CBS_get_any_asn1_element(in, out, NULL, NULL)) {
      return 0;
    }
    *out_storage = NULL;
    return 1;
  }

  size_t len;
  if (!CBB_init(&cbb, CBS_len(in)) ||
      !cbs_convert_ber(in, &cbb, 0, 0, 0) ||
      !CBB_finish(&cbb, out_storage, &len)) {
    CBB_cleanup(&cbb);
    return 0;
  }

  CBS_init(out, *out_storage, len);
  return 1;
}